

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O1

int Train(void *hPtr,char *input,char *output,TrainingArgs trainArgs,AutotuneArgs autotuneArgs,
         TrainProgressCallback trainCallback,AutotuneProgressCallback autotuneCallback,char *label,
         char *pretrainedVectors,bool debug)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TrainingArgs args_00;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  int64_t iVar7;
  ostream *poVar8;
  ostream *poVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  TrainingArgs *pTVar14;
  double *pdVar15;
  FastText *this;
  char *pcVar16;
  string vectorsPath;
  string modelPath;
  ofstream stream;
  Args args;
  undefined1 in_stack_fffffffffffffab8 [96];
  string local_4b0;
  FastText *local_490;
  _Any_data local_488;
  code *local_478;
  code *pcStack_470;
  AutotuneProgressCallback local_460;
  FastText *local_458;
  char *local_450;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  undefined1 local_3c8 [16];
  FastText local_3b8;
  ios_base local_2d0 [264];
  undefined1 local_1c8 [56];
  _Alloc_hider local_190;
  size_type local_188;
  _Alloc_hider local_170;
  size_type local_168;
  double local_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  loss_name local_128;
  model_name local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  double local_110;
  _Alloc_hider local_108;
  size_type local_100;
  int local_e8;
  _Alloc_hider local_e0;
  size_type local_d8;
  int local_bc;
  _Alloc_hider local_a0;
  size_type local_98;
  _Alloc_hider local_80;
  size_type local_78;
  int local_60;
  int local_5c;
  _Alloc_hider local_58;
  size_type local_50;
  int local_38;
  
  pTVar14 = &trainArgs;
  pdVar15 = (double *)&stack0xfffffffffffffab8;
  local_490 = (FastText *)hPtr;
  local_460 = autotuneCallback;
  local_458 = (FastText *)trainCallback;
  for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
    *pdVar15 = pTVar14->lr;
    pTVar14 = (TrainingArgs *)&pTVar14->lrUpdateRate;
    pdVar15 = pdVar15 + 1;
  }
  args_00.dsub._4_4_ = trainArgs.dsub._4_4_;
  args_00._0_96_ = in_stack_fffffffffffffab8;
  local_450 = label;
  CreateArgs((Args *)local_1c8,args_00,autotuneArgs,label,pretrainedVectors);
  if (input == (char *)0x0) {
    input = "";
  }
  local_3c8._0_8_ = &local_3b8;
  sVar6 = strlen(input);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,input,input + sVar6);
  std::__cxx11::string::operator=((string *)&local_190,(string *)local_3c8);
  if ((FastText *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,
                    (ulong)((long)&((local_3b8.args_.
                                     super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->manualArgs_)._M_h._M_buckets + 1));
  }
  if (output == (char *)0x0) {
    output = "";
  }
  local_3c8._0_8_ = &local_3b8;
  sVar6 = strlen(output);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,output,output + sVar6);
  std::__cxx11::string::operator=((string *)&local_170,(string *)local_3c8);
  if ((FastText *)local_3c8._0_8_ != &local_3b8) {
    operator_delete((void *)local_3c8._0_8_,
                    (ulong)((long)&((local_3b8.args_.
                                     super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->manualArgs_)._M_h._M_buckets + 1));
  }
  if (local_188 == 0) {
    iVar13 = -1;
    std::__cxx11::string::_M_replace
              (0x158518,0,(char *)_lastError_abi_cxx11_._M_string_length,0x14972e);
    goto LAB_00143a81;
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  sVar6 = strlen(output);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,output,output + sVar6);
  sVar3 = local_4b0._M_string_length;
  if (local_4b0._M_string_length == 0) {
    bVar4 = false;
    bVar5 = false;
  }
  else {
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,".bin","");
    bVar4 = EndsWith(&local_4b0,&local_3e8,true);
    if (bVar4) {
      bVar5 = true;
      bVar4 = false;
    }
    else {
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,".ftz","");
      bVar5 = EndsWith(&local_4b0,&local_408,true);
      bVar4 = true;
    }
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2)) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  this = local_490;
  if ((sVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2)) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar5 != false) {
    std::__cxx11::string::substr((ulong)local_3c8,(ulong)&local_4b0);
    std::__cxx11::string::operator=((string *)&local_4b0,(string *)local_3c8);
    if ((FastText *)local_3c8._0_8_ != &local_3b8) {
      operator_delete((void *)local_3c8._0_8_,
                      (ulong)((long)&((local_3b8.args_.
                                       super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->manualArgs_)._M_h._M_buckets + 1));
    }
  }
  paVar1 = &local_428.field_2;
  local_428._M_string_length = 0;
  local_428.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_448.field_2;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = '\0';
  local_448._M_dataplus._M_p = (pointer)paVar2;
  local_428._M_dataplus._M_p = (pointer)paVar1;
  if (local_4b0._M_string_length != 0) {
    bVar4 = fasttext::Args::hasAutotune((Args *)local_1c8);
    if (bVar4) {
      iVar7 = fasttext::Args::getAutotuneModelSize((Args *)local_1c8);
      if (iVar7 == -1) goto LAB_001426e0;
      local_3c8._0_8_ = &local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c8,local_4b0._M_dataplus._M_p,
                 local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
      std::__cxx11::string::append(local_3c8);
    }
    else {
LAB_001426e0:
      local_3c8._0_8_ = &local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c8,local_4b0._M_dataplus._M_p,
                 local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
      std::__cxx11::string::append(local_3c8);
    }
    std::__cxx11::string::operator=((string *)&local_428,(string *)local_3c8);
    if ((FastText *)local_3c8._0_8_ != &local_3b8) {
      operator_delete((void *)local_3c8._0_8_,
                      (ulong)((long)&((local_3b8.args_.
                                       super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->manualArgs_)._M_h._M_buckets + 1));
    }
    local_3c8._0_8_ = &local_3b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3c8,local_4b0._M_dataplus._M_p,
               local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
    std::__cxx11::string::append(local_3c8);
    std::__cxx11::string::operator=((string *)&local_448,(string *)local_3c8);
    if ((FastText *)local_3c8._0_8_ != &local_3b8) {
      operator_delete((void *)local_3c8._0_8_,
                      (ulong)((long)&((local_3b8.args_.
                                       super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->manualArgs_)._M_h._M_buckets + 1));
    }
  }
  if (debug) {
    std::ofstream::ofstream(local_3c8,"_train.txt",_S_out);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"= eargs",7);
    std::ios::widen((char)(ostream *)local_3c8 + (char)*(undefined8 *)(local_3c8._0_8_ + -0x18));
    std::ostream::put((char)local_3c8);
    std::ostream::flush();
    sVar6 = strlen(input);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,input,sVar6);
    std::ios::widen((char)(ostream *)local_3c8 + (char)*(undefined8 *)(local_3c8._0_8_ + -0x18));
    std::ostream::put((char)local_3c8);
    poVar8 = (ostream *)std::ostream::flush();
    sVar6 = strlen(output);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,output,sVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    poVar8 = std::ostream::_M_insert<double>(trainArgs.lr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.lrUpdateRate);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.dim);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.ws);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.epoch);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.minCount);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.minCountLabel);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.neg);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.wordNgrams);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.loss);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.model);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.bucket);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.minn);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.maxn);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.thread);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    poVar8 = std::ostream::_M_insert<double>(trainArgs.t);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    pcVar16 = local_450;
    if (local_450 == (char *)0x0) {
      pcVar16 = "";
    }
    sVar6 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar16,sVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.verbose);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar8 = (ostream *)std::ostream::flush();
    if (pretrainedVectors == (char *)0x0) {
      pretrainedVectors = "";
    }
    sVar6 = strlen(pretrainedVectors);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pretrainedVectors,sVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    bVar4 = (bool)std::ostream::flush();
    poVar8 = std::ostream::_M_insert<bool>(bVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,trainArgs.seed);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    bVar4 = (bool)std::ostream::flush();
    poVar8 = std::ostream::_M_insert<bool>(bVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    bVar4 = (bool)std::ostream::flush();
    poVar8 = std::ostream::_M_insert<bool>(bVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    bVar4 = (bool)std::ostream::flush();
    poVar8 = std::ostream::_M_insert<bool>(bVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    uVar11 = std::ostream::flush();
    poVar8 = std::ostream::_M_insert<unsigned_long>(uVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    uVar11 = std::ostream::flush();
    poVar8 = std::ostream::_M_insert<unsigned_long>(uVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    if (autotuneArgs.validationFile == (char *)0x0) {
      autotuneArgs.validationFile = "";
    }
    sVar6 = strlen(autotuneArgs.validationFile);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,autotuneArgs.validationFile,sVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    if (autotuneArgs.metric == (char *)0x0) {
      autotuneArgs.metric = "";
    }
    sVar6 = strlen(autotuneArgs.metric);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,autotuneArgs.metric,sVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,autotuneArgs.predictions);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,autotuneArgs.duration);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar8 = (ostream *)std::ostream::flush();
    pcVar16 = "";
    if (autotuneArgs.modelSize != (char *)0x0) {
      pcVar16 = autotuneArgs.modelSize;
    }
    sVar6 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar16,sVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,autotuneArgs.verbose);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"= args",6);
    std::ios::widen((char)(ostream *)local_3c8 + (char)*(undefined8 *)(local_3c8._0_8_ + -0x18));
    std::ostream::put((char)local_3c8);
    std::ostream::flush();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3c8,local_190._M_p,local_188);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_170._M_p,local_168);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    poVar8 = std::ostream::_M_insert<double>(local_150);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_148);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_144);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_140);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_13c);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_138);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_134);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_130);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_12c);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_128);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_124);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_120);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_11c);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_118);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_114);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    poVar8 = std::ostream::_M_insert<double>(local_110);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_108._M_p,local_100);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_e8);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar8 = (ostream *)std::ostream::flush();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_e0._M_p,local_d8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    bVar4 = (bool)std::ostream::flush();
    poVar8 = std::ostream::_M_insert<bool>(bVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_bc);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    bVar4 = (bool)std::ostream::flush();
    poVar8 = std::ostream::_M_insert<bool>(bVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    bVar4 = (bool)std::ostream::flush();
    poVar8 = std::ostream::_M_insert<bool>(bVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    bVar4 = (bool)std::ostream::flush();
    poVar8 = std::ostream::_M_insert<bool>(bVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    uVar11 = std::ostream::flush();
    poVar8 = std::ostream::_M_insert<unsigned_long>(uVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    uVar11 = std::ostream::flush();
    poVar8 = std::ostream::_M_insert<unsigned_long>(uVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_a0._M_p,local_98);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_80._M_p,local_78);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_60);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_5c);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    poVar8 = (ostream *)std::ostream::flush();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_58._M_p,local_50);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_38);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    std::ofstream::close();
    local_3c8._0_8_ = _VTT;
    *(undefined8 *)(local_3c8 + *(long *)&_VTT[-1].quant_) = _log;
    std::filebuf::~filebuf((filebuf *)(local_3c8 + 8));
    std::ios_base::~ios_base(local_2d0);
    this = local_490;
  }
  bVar4 = fasttext::Args::hasAutotune((Args *)local_1c8);
  if (bVar4) {
    fasttext::Autotune::Autotune((Autotune *)local_3c8,this);
    local_478 = (code *)0x0;
    pcStack_470 = (code *)0x0;
    local_488._M_unused._M_object = (AutotuneProgressCallback)0x0;
    local_488._8_8_ = 0;
    if (local_460 != (AutotuneProgressCallback)0x0) {
      local_488._M_unused._M_object = local_460;
      pcStack_470 = std::
                    _Function_handler<void_(double,_int,_double,_double),_void_(*)(double,_int,_double,_double)>
                    ::_M_invoke;
      local_478 = std::
                  _Function_handler<void_(double,_int,_double,_double),_void_(*)(double,_int,_double,_double)>
                  ::_M_manager;
    }
    fasttext::Autotune::train
              ((Autotune *)local_3c8,(Args *)local_1c8,(AutotuneCallback *)&local_488);
    if (local_478 != (code *)0x0) {
      (*local_478)(&local_488,&local_488,__destroy_functor);
    }
    fasttext::Autotune::~Autotune((Autotune *)local_3c8);
  }
  else {
    local_3b8.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_3b8.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_3c8._0_8_ = (FastText *)0x0;
    local_3c8._8_8_ = 0.0;
    if (local_458 != (FastText *)0x0) {
      local_3c8._0_8_ = local_458;
      local_3b8.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              std::
              _Function_handler<void_(float,_float,_double,_double,_long),_void_(*)(float,_float,_double,_double,_long)>
              ::_M_invoke;
      local_3b8.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           std::
           _Function_handler<void_(float,_float,_double,_double,_long),_void_(*)(float,_float,_double,_double,_long)>
           ::_M_manager;
    }
    fasttext::FastText::train(this,(Args *)local_1c8,(TrainCallback *)local_3c8);
    if (local_3b8.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*(code *)local_3b8.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)((_Any_data *)local_3c8,(_Any_data *)local_3c8,__destroy_functor);
    }
  }
  if (local_428._M_string_length != 0) {
    fasttext::FastText::saveModel(this,&local_428);
  }
  if (local_448._M_string_length != 0) {
    fasttext::FastText::saveVectors(this,&local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar2) {
    operator_delete(local_448._M_dataplus._M_p,
                    CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                             local_448.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != paVar1) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                             local_428.field_2._M_local_buf[0]) + 1);
  }
  iVar13 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    iVar13 = 0;
  }
LAB_00143a81:
  fasttext::Args::~Args((Args *)local_1c8);
  return iVar13;
}

Assistant:

Train(void* hPtr, const char* input, const char* output, TrainingArgs trainArgs, AutotuneArgs autotuneArgs,
        TrainProgressCallback trainCallback, AutotuneProgressCallback autotuneCallback,
        const char* label, const char* pretrainedVectors, bool debug)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto args = CreateArgs(trainArgs, autotuneArgs, label, pretrainedVectors);
    args.input = std::string(EMPTYIFNULL(input));
    args.output = std::string(EMPTYIFNULL(output));

    if (args.input.empty())
    {
        _lastError = "Empty input file specified!";
        return -1;
    }

    std::string outPath(EMPTYIFNULL(output));
    if (!outPath.empty() && (EndsWith(outPath, ".bin", true) || EndsWith(outPath, ".ftz", true))) {
        outPath = outPath.substr(0, outPath.length()-4);
    }

    std::string modelPath;
    std::string vectorsPath;

    if (!outPath.empty()) {
        modelPath = args.hasAutotune() && args.getAutotuneModelSize() != Args::kUnlimitedModelSize
                         ? outPath + ".ftz"
                         : outPath + ".bin";
        vectorsPath = outPath + ".vec";
    }

    if (debug)
    {
        ofstream stream("_train.txt");
        stream << "= eargs" << endl;

        stream << EMPTYIFNULL(input) << endl
            << EMPTYIFNULL(output) << endl
            << trainArgs.lr << endl
            << trainArgs.lrUpdateRate << endl
            << trainArgs.dim << endl
            << trainArgs.ws << endl
            << trainArgs.epoch << endl
            << trainArgs.minCount << endl
            << trainArgs.minCountLabel << endl
            << trainArgs.neg << endl
            << trainArgs.wordNgrams << endl
            << (int)trainArgs.loss << endl
            << (int)trainArgs.model << endl
            << trainArgs.bucket << endl
            << trainArgs.minn << endl
            << trainArgs.maxn << endl
            << trainArgs.thread << endl
            << trainArgs.t << endl
            << EMPTYIFNULL(label) << endl
            << trainArgs.verbose << endl
            << EMPTYIFNULL(pretrainedVectors) << endl
            << trainArgs.saveOutput << endl
            << trainArgs.seed << endl
            << trainArgs.qout << endl
            << trainArgs.retrain << endl
            << trainArgs.qnorm << endl
            << trainArgs.cutoff << endl
            << trainArgs.dsub << endl

            << EMPTYIFNULL(autotuneArgs.validationFile) << endl
            << EMPTYIFNULL(autotuneArgs.metric) << endl
            << autotuneArgs.predictions << endl
            << autotuneArgs.duration << endl
            << EMPTYIFNULL(autotuneArgs.modelSize) << endl
            << autotuneArgs.verbose << endl;

        stream << "= args" << endl;

        stream << args.input << endl
            << args.output << endl
            << args.lr << endl
            << args.lrUpdateRate << endl
            << args.dim << endl
            << args.ws << endl
            << args.epoch << endl
            << args.minCount << endl
            << args.minCountLabel << endl
            << args.neg << endl
            << args.wordNgrams << endl
            << (int)args.loss << endl
            << (int)args.model << endl
            << args.bucket << endl
            << args.minn << endl
            << args.maxn << endl
            << args.thread << endl
            << args.t << endl
            << args.label << endl
            << args.verbose << endl
            << args.pretrainedVectors << endl
            << args.saveOutput << endl
            << args.seed << endl
            << args.qout << endl
            << args.retrain << endl
            << args.qnorm << endl
            << args.cutoff << endl
            << args.dsub << endl
            << args.autotuneValidationFile << endl
            << args.autotuneMetric << endl
            << args.autotunePredictions << endl
            << args.autotuneDuration << endl
            << args.autotuneModelSize << endl
            << args.autotuneVerbose << endl;

        stream.close();
    }

    try {
        if (args.hasAutotune())
        {
            Autotune autotune(fastText);
            autotune.train(args, autotuneCallback);
        }
        else
            fastText->train(args, trainCallback);

        if (!modelPath.empty())
            fastText->saveModel(modelPath);

        if (!vectorsPath.empty())
            fastText->saveVectors(vectorsPath);

        return 0;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}